

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_decay_deadline_init(arena_decay_t *decay)

{
  nstime_t *time;
  long lVar1;
  uint64_t uVar2;
  byte bVar3;
  ulong uVar4;
  ulong ns;
  nstime_t jitter;
  
  time = &decay->deadline;
  nstime_copy(time,&decay->epoch);
  nstime_add(time,&decay->interval);
  if (0 < (decay->time_ms).repr) {
    uVar2 = nstime_ns(&decay->interval);
    uVar4 = uVar2;
    if (1 < uVar2) {
      lVar1 = 0x3f;
      if (uVar2 - 1 != 0) {
        for (; uVar2 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = 1L << ((char)lVar1 + 1U & 0x3f);
    }
    lVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    bVar3 = 0x41;
    if (uVar4 != 0) {
      bVar3 = 0x40 - (char)lVar1;
    }
    uVar4 = decay->jitter_state;
    do {
      uVar4 = uVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      ns = uVar4 >> (bVar3 & 0x3f);
    } while (uVar2 <= ns);
    decay->jitter_state = uVar4;
    nstime_init(&jitter,ns);
    nstime_add(time,&jitter);
  }
  return;
}

Assistant:

static void
arena_decay_deadline_init(arena_decay_t *decay) {
	/*
	 * Generate a new deadline that is uniformly random within the next
	 * epoch after the current one.
	 */
	nstime_copy(&decay->deadline, &decay->epoch);
	nstime_add(&decay->deadline, &decay->interval);
	if (arena_decay_ms_read(decay) > 0) {
		nstime_t jitter;

		nstime_init(&jitter, prng_range_u64(&decay->jitter_state,
		    nstime_ns(&decay->interval)));
		nstime_add(&decay->deadline, &jitter);
	}
}